

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O2

void __thiscall
gmath::RadialTangentialDistortion::RadialTangentialDistortion
          (RadialTangentialDistortion *this,Properties *prop,int id)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int in_ECX;
  int iVar4;
  undefined4 in_register_00000014;
  string local_48;
  
  (this->super_Distortion)._vptr_Distortion = (_func_int **)&PTR__Distortion_00173a58;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)"p1",(char *)CONCAT44(in_register_00000014,id),
             in_ECX);
  iVar4 = 0x15b948;
  gutil::Properties::getValue<double>(prop,local_48._M_dataplus._M_p,this->kd,"0");
  std::__cxx11::string::~string((string *)&local_48);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)"p2",(char *)(ulong)(uint)id,iVar4);
  iVar4 = 0x15b948;
  gutil::Properties::getValue<double>(prop,local_48._M_dataplus._M_p,this->kd + 1,"0");
  std::__cxx11::string::~string((string *)&local_48);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)"k1",(char *)(ulong)(uint)id,iVar4);
  iVar4 = 0x15b948;
  gutil::Properties::getValue<double>(prop,local_48._M_dataplus._M_p,this->kd + 2,"0");
  std::__cxx11::string::~string((string *)&local_48);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)"k2",(char *)(ulong)(uint)id,iVar4);
  iVar4 = 0x15b948;
  gutil::Properties::getValue<double>(prop,local_48._M_dataplus._M_p,this->kd + 3,"0");
  std::__cxx11::string::~string((string *)&local_48);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)"k3",(char *)(ulong)(uint)id,iVar4);
  gutil::Properties::getValue<double>(prop,local_48._M_dataplus._M_p,this->kd + 4,"0");
  std::__cxx11::string::~string((string *)&local_48);
  this->kn = 0;
  dVar1 = this->kd[4];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->kn = 1;
    iVar4 = 2;
  }
  else {
    dVar2 = this->kd[3];
    iVar4 = 1;
    if ((dVar2 == 0.0) && (!NAN(dVar2))) {
      iVar3 = 0;
      if ((dVar1 == 0.0) && (!NAN(dVar1))) goto LAB_001553e4;
    }
  }
  this->kn = iVar4;
  iVar3 = iVar4;
LAB_001553e4:
  if (this->kd[2] != 0.0 || iVar3 != 0) {
    this->kn = iVar3 + 1;
  }
  return;
}

Assistant:

RadialTangentialDistortion::RadialTangentialDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("p1", id).c_str(), kd[0], "0");
  prop.getValue(getCameraKey("p2", id).c_str(), kd[1], "0");

  prop.getValue(getCameraKey("k1", id).c_str(), kd[2], "0");
  prop.getValue(getCameraKey("k2", id).c_str(), kd[3], "0");
  prop.getValue(getCameraKey("k3", id).c_str(), kd[4], "0");

  kn=0;

  if (kd[4] != 0)
  {
    kn++;
  }

  if (kd[3] != 0 || kn > 0)
  {
    kn++;
  }

  if (kd[2] != 0 || kn > 0)
  {
    kn++;
  }
}